

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::CIRS2Observed
               (CESkyCoord *in_cirs,CESkyCoord *out_observed,CEDate *date,CEObserver *observer,
               CESkyCoord *observed_cirs,CEAngle *hour_angle)

{
  int iVar1;
  CEObserver *in_RCX;
  long *in_RDX;
  double *in_RSI;
  long *in_RDI;
  long *in_R8;
  long in_R9;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  CEAngle *this;
  double *angle;
  CEAngleType *angle_type;
  CEAngle CVar10;
  int err_code;
  double zen;
  double az;
  double temp_hour_angle;
  double temp_dec;
  double temp_ra;
  undefined8 in_stack_fffffffffffffd40;
  CEDateType date_format;
  double in_stack_fffffffffffffd48;
  CEDate *in_stack_fffffffffffffd50;
  undefined4 local_1d4;
  undefined1 local_1d0 [16];
  string *in_stack_fffffffffffffe40;
  int *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe54;
  string *in_stack_fffffffffffffe58;
  sofa_error *in_stack_fffffffffffffe60;
  undefined1 local_198 [22];
  undefined1 local_182;
  allocator local_181;
  string local_180 [32];
  undefined4 local_160;
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [32];
  undefined1 local_110 [64];
  CEAngle local_d0 [2];
  undefined1 local_b0 [64];
  CEAngle local_70;
  int local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  long *local_28;
  CEObserver *local_20;
  long *local_18;
  double *local_10;
  long *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffd40 >> 0x20);
  local_38 = 0;
  local_40 = 0;
  local_48 = 0;
  local_50 = 0;
  local_58 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,date_format);
  (**(code **)(*in_RDI + 0x18))(&local_70,in_RDI,local_b0);
  dVar2 = CEAngle::operator_cast_to_double(&local_70);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,date_format);
  (**(code **)(*local_8 + 0x20))(local_d0,local_8,local_110);
  dVar3 = CEAngle::operator_cast_to_double(local_d0);
  dVar4 = CEDate::GetMJD2JDFactor();
  uVar5 = (**(code **)(*local_18 + 0x28))();
  dVar6 = CEDate::dut1((CEDate *)0x1408a8);
  dVar7 = CEObserver::Longitude_Rad(local_20);
  dVar8 = CEObserver::Latitude_Rad(local_20);
  dVar9 = CEObserver::Elevation_m(local_20);
  CEDate::xpolar((CEDate *)0x140908);
  CEDate::ypolar((CEDate *)0x140920);
  this = (CEAngle *)CEObserver::Pressure_hPa(local_20);
  angle = (double *)CEObserver::Temperature_C(local_20);
  angle_type = (CEAngleType *)CEObserver::RelativeHumidity(local_20);
  CEObserver::Wavelength_um(local_20);
  iVar1 = iauAtio13(dVar2,dVar3,dVar4,uVar5,dVar6,dVar7,dVar8,dVar9,&local_50,&local_58,&local_48,
                    &local_38,&local_40);
  CEAngle::~CEAngle((CEAngle *)0x140a69);
  CEDate::~CEDate((CEDate *)0x140a76);
  CEAngle::~CEAngle((CEAngle *)0x140a83);
  CEDate::~CEDate((CEDate *)0x140a90);
  local_5c = iVar1;
  if (iVar1 == -1) {
    local_182 = 1;
    uVar5 = __cxa_allocate_exception(0xa8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"CESkyCoord::CIRS2Observed",&local_131);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_158,"iauAtio13",&local_159);
    local_160 = 0xffffffff;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_180,"SOFA method was passed an unacceptable date",&local_181)
    ;
    CEException::sofa_error::sofa_error
              (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
               (string *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
               in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    local_182 = 0;
    __cxa_throw(uVar5,&CEException::sofa_error::typeinfo,CEException::sofa_error::~sofa_error);
  }
  CEAngle::Rad(local_10);
  CVar10 = CEAngle::Rad(local_10);
  (**(code **)((long)*local_10 + 0x28))
            (CVar10.angle_,local_10,local_198,&stack0xfffffffffffffe58,&stack0xfffffffffffffe54);
  CEAngle::~CEAngle((CEAngle *)0x140d6d);
  CEAngle::~CEAngle((CEAngle *)0x140d7a);
  if (local_28 != (long *)0x0) {
    CEAngle::Rad(local_10);
    CVar10 = CEAngle::Rad(local_10);
    local_1d4 = 0;
    (**(code **)(*local_28 + 0x28))
              (CVar10.angle_,local_28,&stack0xfffffffffffffe40,local_1d0,&local_1d4);
    CEAngle::~CEAngle((CEAngle *)0x140e02);
    CEAngle::~CEAngle((CEAngle *)0x140e0f);
  }
  if (local_30 != 0) {
    CEAngle::SetAngle(this,angle,angle_type);
  }
  return;
}

Assistant:

void CESkyCoord::CIRS2Observed(const CESkyCoord& in_cirs,
                               CESkyCoord*       out_observed,
                               const CEDate&     date,
                               const CEObserver& observer,
                               CESkyCoord*       observed_cirs,
                               CEAngle*          hour_angle)
{
    // Setup the observed RA, Dec and hour_angle variables
    double temp_ra(0.0);
    double temp_dec(0.0);
    double temp_hour_angle(0.0);

    // Call the necessary sofa method
    double az(0.0);
    double zen(0.0);
    int err_code = iauAtio13(in_cirs.XCoord(), 
                             in_cirs.YCoord(),
                             CEDate::GetMJD2JDFactor(), date.MJD(),
                             date.dut1(),
                             observer.Longitude_Rad(),
                             observer.Latitude_Rad(),
                             observer.Elevation_m(),
                             date.xpolar(), date.ypolar(),
                             observer.Pressure_hPa(),
                             observer.Temperature_C(),
                             observer.RelativeHumidity(),
                             observer.Wavelength_um(),
                             &az, &zen,
                             &temp_hour_angle, 
                             &temp_ra, &temp_dec);
    
    // Handle the error code
    if (err_code == -1) {
        throw CEException::sofa_error("CESkyCoord::CIRS2Observed",
                                      "iauAtio13", -1,
                                      "SOFA method was passed an unacceptable date");
    }

    // Set the output coordinates
    out_observed->SetCoordinates(CEAngle::Rad(az), CEAngle::Rad(zen), 
                                 CESkyCoordType::OBSERVED);

    // If passed, set the observed CIRS coordinates
    if (observed_cirs != nullptr) {
        observed_cirs->SetCoordinates(CEAngle::Rad(temp_ra), CEAngle::Rad(temp_dec),
                                      CESkyCoordType::CIRS);
    }

    // Set the hour angle
    if (hour_angle != nullptr) {
        hour_angle->SetAngle(temp_hour_angle, CEAngleType::RADIANS);
    }

    return;
}